

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

void __thiscall
libebml::EbmlMaster::Read
          (EbmlMaster *this,EbmlStream *inDataStream,EbmlSemanticContext *sContext,
          int *UpperEltFound,EbmlElement **FoundElt,bool AllowDummyElt,ScopeMode ReadFully)

{
  size_t sVar1;
  EbmlSemanticContext *pEVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference ppEVar7;
  undefined4 extraout_var;
  IOCallback *pIVar8;
  uint64 uVar9;
  ulong uVar10;
  long lVar11;
  undefined4 extraout_var_00;
  reference ppEVar12;
  EbmlId local_88;
  __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
  local_78;
  EbmlElement **local_70;
  __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
  local_68;
  iterator CrcItr;
  iterator Itr;
  uint64 uStack_50;
  bool DeleteElement;
  uint64 MaxSizeToRead;
  size_t Index;
  EbmlElement *ElementLevelA;
  EbmlElement **ppEStack_30;
  bool AllowDummyElt_local;
  EbmlElement **FoundElt_local;
  int *UpperEltFound_local;
  EbmlSemanticContext *sContext_local;
  EbmlStream *inDataStream_local;
  EbmlMaster *this_local;
  
  if (ReadFully != SCOPE_NO_DATA) {
    ElementLevelA._7_1_ = AllowDummyElt;
    ppEStack_30 = FoundElt;
    FoundElt_local = (EbmlElement **)UpperEltFound;
    UpperEltFound_local = (int *)sContext;
    sContext_local = (EbmlSemanticContext *)inDataStream;
    inDataStream_local = (EbmlStream *)this;
    for (MaxSizeToRead = 0;
        sVar6 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::size
                          (&this->ElementList), MaxSizeToRead < sVar6;
        MaxSizeToRead = MaxSizeToRead + 1) {
      ppEVar7 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                operator[](&this->ElementList,MaxSizeToRead);
      bVar3 = EbmlElement::IsLocked(*ppEVar7);
      if (!bVar3) {
        ppEVar7 = std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::
                  operator[](&this->ElementList,MaxSizeToRead);
        if (*ppEVar7 != (value_type)0x0) {
          (*(*ppEVar7)->_vptr_EbmlElement[1])();
        }
      }
    }
    std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::clear
              (&this->ElementList);
    bVar3 = EbmlElement::IsFiniteSize(&this->super_EbmlElement);
    if (bVar3) {
      iVar5 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
      uStack_50 = CONCAT44(extraout_var,iVar5);
    }
    else {
      uStack_50 = 0x7fffffff;
    }
    if (uStack_50 != 0) {
      pIVar8 = EbmlStream::I_O((EbmlStream *)sContext_local);
      uVar9 = EbmlElement::GetSizePosition(&this->super_EbmlElement);
      iVar5 = EbmlElement::GetSizeLength(&this->super_EbmlElement);
      (*pIVar8->_vptr_IOCallback[3])(pIVar8,uVar9 + (long)iVar5,0);
      Index = (size_t)EbmlStream::FindNextElement
                                ((EbmlStream *)sContext_local,
                                 (EbmlSemanticContext *)UpperEltFound_local,(int *)FoundElt_local,
                                 uStack_50,(bool)(ElementLevelA._7_1_ & 1),1);
LAB_001bcb13:
      bVar3 = false;
      if ((Index != 0) && (bVar3 = false, *(int *)FoundElt_local < 1)) {
        bVar3 = uStack_50 != 0;
      }
      if (bVar3) {
        bVar3 = EbmlElement::IsFiniteSize(&this->super_EbmlElement);
        if ((bVar3) && (bVar3 = EbmlElement::IsFiniteSize((EbmlElement *)Index), bVar3)) {
          uStack_50 = EbmlElement::GetEndPosition(&this->super_EbmlElement);
          uVar9 = EbmlElement::GetEndPosition((EbmlElement *)Index);
          uStack_50 = uStack_50 - uVar9;
        }
        if (((ElementLevelA._7_1_ & 1) == 0) &&
           (uVar10 = (**(code **)(*(long *)Index + 0x68))(), (uVar10 & 1) != 0)) {
          bVar3 = EbmlElement::IsFiniteSize((EbmlElement *)Index);
          if (!bVar3) {
            if (Index != 0) {
              (**(code **)(*(long *)Index + 8))();
            }
            goto LAB_001bce09;
          }
          EbmlElement::SkipData
                    ((EbmlElement *)Index,(EbmlStream *)sContext_local,
                     (EbmlSemanticContext *)UpperEltFound_local,(EbmlElement *)0x0,false);
          if (Index != 0) {
            (**(code **)(*(long *)Index + 8))();
          }
        }
        else {
          pEVar2 = sContext_local;
          sVar1 = Index;
          lVar11 = (**(code **)(*(long *)Index + 0x20))();
          (**(code **)(*(long *)sVar1 + 0x58))
                    (sVar1,pEVar2,*(undefined8 *)(lVar11 + 0x18),FoundElt_local,ppEStack_30,
                     ElementLevelA._7_1_ & 1,ReadFully);
          bVar3 = true;
          bVar4 = EbmlElement::ValueIsSet((EbmlElement *)Index);
          if ((bVar4) || (ReadFully != SCOPE_ALL_DATA)) {
            std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::push_back
                      (&this->ElementList,(value_type *)&Index);
            bVar3 = false;
          }
          bVar4 = EbmlElement::IsFiniteSize((EbmlElement *)Index);
          pEVar2 = sContext_local;
          sVar1 = Index;
          if (!bVar4) {
            if ((bVar3) && (Index != 0)) {
              (**(code **)(*(long *)Index + 8))();
            }
            if (*(int *)FoundElt_local == 0) goto LAB_001bce09;
            *(int *)FoundElt_local = *(int *)FoundElt_local + -1;
            if ((0 < *(int *)FoundElt_local) || (uStack_50 == 0)) goto LAB_001bce21;
            Index = (size_t)*ppEStack_30;
            goto LAB_001bce09;
          }
          lVar11 = (**(code **)(*(long *)Index + 0x20))();
          EbmlElement::SkipData
                    ((EbmlElement *)sVar1,(EbmlStream *)pEVar2,
                     *(EbmlSemanticContext **)(lVar11 + 0x18),(EbmlElement *)0x0,false);
          if ((bVar3) && (Index != 0)) {
            (**(code **)(*(long *)Index + 8))();
          }
        }
        if (*(int *)FoundElt_local < 1) {
          if (((*(int *)FoundElt_local < 0) &&
              (*(int *)FoundElt_local = *(int *)FoundElt_local + 1, *(int *)FoundElt_local < 0)) ||
             (uStack_50 == 0)) goto LAB_001bce21;
          Index = (size_t)EbmlStream::FindNextElement
                                    ((EbmlStream *)sContext_local,
                                     (EbmlSemanticContext *)UpperEltFound_local,
                                     (int *)FoundElt_local,uStack_50,(bool)(ElementLevelA._7_1_ & 1)
                                     ,1);
        }
        else {
          *(int *)FoundElt_local = *(int *)FoundElt_local + -1;
          if ((0 < *(int *)FoundElt_local) || (uStack_50 == 0)) goto LAB_001bce21;
          Index = (size_t)*ppEStack_30;
        }
        goto LAB_001bcb13;
      }
LAB_001bce09:
      if (0 < *(int *)FoundElt_local) {
        *ppEStack_30 = (EbmlElement *)Index;
      }
    }
LAB_001bce21:
    __gnu_cxx::
    __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
    ::__normal_iterator(&CrcItr);
    __gnu_cxx::
    __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
    ::__normal_iterator(&local_68);
    local_70 = (EbmlElement **)
               std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::begin
                         (&this->ElementList);
    CrcItr = (iterator)local_70;
    while( true ) {
      local_78._M_current =
           (EbmlElement **)
           std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>::end
                     (&this->ElementList);
      bVar3 = __gnu_cxx::operator!=(&CrcItr,&local_78);
      if (!bVar3) break;
      ppEVar12 = __gnu_cxx::
                 __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
                 ::operator*(&CrcItr);
      iVar5 = (*(*ppEVar12)->_vptr_EbmlElement[3])();
      local_88._0_8_ = *(undefined8 *)CONCAT44(extraout_var_00,iVar5);
      local_88.Length = ((undefined8 *)CONCAT44(extraout_var_00,iVar5))[1];
      bVar3 = EbmlId::operator==(&local_88,(EbmlId *)EbmlCrc32::ClassInfos._8_8_);
      if (bVar3) {
        this->bChecksumUsed = true;
        ppEVar12 = __gnu_cxx::
                   __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
                   ::operator*(&CrcItr);
        EbmlCrc32::operator=(&this->Checksum,(EbmlCrc32 *)*ppEVar12);
        local_68._M_current = CrcItr._M_current;
        break;
      }
      __gnu_cxx::
      __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
      ::operator++(&CrcItr);
    }
    if ((this->bChecksumUsed & 1U) != 0) {
      ppEVar12 = __gnu_cxx::
                 __normal_iterator<libebml::EbmlElement_**,_std::vector<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>_>
                 ::operator*(&local_68);
      if (*ppEVar12 != (EbmlElement *)0x0) {
        (*(*ppEVar12)->_vptr_EbmlElement[1])();
      }
      Remove(this,&local_68);
    }
    EbmlElement::SetValueIsSet(&this->super_EbmlElement,true);
  }
  return;
}

Assistant:

void EbmlMaster::Read(EbmlStream & inDataStream, const EbmlSemanticContext & sContext, int & UpperEltFound, EbmlElement * & FoundElt, bool AllowDummyElt, ScopeMode ReadFully)
{
  if (ReadFully == SCOPE_NO_DATA)
    return;

  EbmlElement * ElementLevelA;
  // remove all existing elements, including the mandatory ones...
  size_t Index;
  for (Index=0; Index<ElementList.size(); Index++) {
    if (!(*ElementList[Index]).IsLocked()) {
      delete ElementList[Index];
    }
  }
  ElementList.clear();
  uint64 MaxSizeToRead;

  if (IsFiniteSize())
    MaxSizeToRead = GetSize();
  else
    MaxSizeToRead = 0x7FFFFFFF;

  // read blocks and discard the ones we don't care about
  if (MaxSizeToRead > 0)
  {
    inDataStream.I_O().setFilePointer(GetSizePosition() + GetSizeLength(), seek_beginning);
    ElementLevelA = inDataStream.FindNextElement(sContext, UpperEltFound, MaxSizeToRead, AllowDummyElt);
    while (ElementLevelA != NULL && UpperEltFound <= 0 && MaxSizeToRead > 0) {
      if (IsFiniteSize() && ElementLevelA->IsFiniteSize())
        MaxSizeToRead = GetEndPosition() - ElementLevelA->GetEndPosition(); // even if it's the default value
      if (!AllowDummyElt && ElementLevelA->IsDummy()) {
        if (ElementLevelA->IsFiniteSize()) {
          ElementLevelA->SkipData(inDataStream, sContext);
          delete ElementLevelA; // forget this unknown element
        } else {
          delete ElementLevelA; // forget this unknown element
          break;
        }
      } else {
        ElementLevelA->Read(inDataStream, EBML_CONTEXT(ElementLevelA), UpperEltFound, FoundElt, AllowDummyElt, ReadFully);

        // Discard elements that couldn't be read properly if
        // SCOPE_ALL_DATA has been requested. This can happen
        // e.g. if block data is defective.
        bool DeleteElement = true;

        if (ElementLevelA->ValueIsSet() || (ReadFully != SCOPE_ALL_DATA)) {
          ElementList.push_back(ElementLevelA);
          DeleteElement = false;
        }

        // just in case
        if (ElementLevelA->IsFiniteSize()) {
          ElementLevelA->SkipData(inDataStream, EBML_CONTEXT(ElementLevelA));
          if (DeleteElement)
            delete ElementLevelA;
        } else {
          if (DeleteElement)
            delete ElementLevelA;

          if (UpperEltFound) {
            --UpperEltFound;
            if (UpperEltFound > 0 || MaxSizeToRead <= 0)
              goto processCrc;
            ElementLevelA = FoundElt;
          }

          break;
        }
      }

      if (UpperEltFound > 0) {
        UpperEltFound--;
        if (UpperEltFound > 0 || MaxSizeToRead <= 0)
          goto processCrc;
        ElementLevelA = FoundElt;
        continue;
      }

      if (UpperEltFound < 0) {
        UpperEltFound++;
        if (UpperEltFound < 0)
          goto processCrc;
      }

      if (MaxSizeToRead <= 0)
        goto processCrc;// this level is finished

      ElementLevelA = inDataStream.FindNextElement(sContext, UpperEltFound, MaxSizeToRead, AllowDummyElt);
    }
    if (UpperEltFound > 0) {
      FoundElt = ElementLevelA;
    }
  }
processCrc:

  EBML_MASTER_ITERATOR Itr, CrcItr;
  for (Itr = ElementList.begin(); Itr != ElementList.end();) {
    if ((EbmlId)(*(*Itr)) == EBML_ID(EbmlCrc32)) {
      bChecksumUsed = true;
      // remove the element
      Checksum = *(static_cast<EbmlCrc32*>(*Itr));
      CrcItr = Itr;
      break;
    }
    ++Itr;
  }

  if (bChecksumUsed)
  {
    delete *CrcItr;
    Remove(CrcItr);
  }

  SetValueIsSet();
}